

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

void __thiscall Potassco::TheoryData::removeTerm(TheoryData *this,Id_t termId)

{
  void *pvVar1;
  ulong uVar2;
  DestroyT local_11;
  
  if (termId < (uint)((this->data_->terms).top >> 3)) {
    pvVar1 = (this->data_->terms).mem.beg_;
    uVar2 = (ulong)termId;
    if (*(long *)((long)pvVar1 + uVar2 * 8) != -1) {
      DestroyT::operator()(&local_11,(TheoryTerm *)((long)pvVar1 + uVar2 * 8));
      *(undefined8 *)((long)(this->data_->terms).mem.beg_ + uVar2 * 8) = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

uint32_t TheoryData::numTerms() const {
	return data_->terms.size();
}